

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_2,_0>::calcPartialsPartialsAutoScaling
          (BeagleCPU4StateImpl<double,_2,_0> *this,double *destP,double *partials1,double *matrices1
          ,double *partials2,double *matrices2,int *activateScaling)

{
  int iVar1;
  int iVar2;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  int expMax;
  int expTmp;
  double sum23;
  double sum22;
  double sum21;
  double sum20;
  double sum13;
  double sum12;
  double sum11;
  double sum10;
  double p23;
  double p22;
  double p21;
  double p20;
  double p13;
  double p12;
  double p11;
  double p10;
  int k;
  double m233;
  double m232;
  double m231;
  double m230;
  double m223;
  double m222;
  double m221;
  double m220;
  double m213;
  double m212;
  double m211;
  double m210;
  double m203;
  double m202;
  double m201;
  double m200;
  double m133;
  double m132;
  double m131;
  double m130;
  double m123;
  double m122;
  double m121;
  double m120;
  double m113;
  double m112;
  double m111;
  double m110;
  double m103;
  double m102;
  double m101;
  double m100;
  int w;
  int u;
  int l;
  int local_1d0;
  int local_1cc;
  double local_1c8;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  double local_198;
  double local_190;
  ulong local_188;
  ulong local_180;
  double local_178;
  ulong local_170;
  ulong local_168;
  ulong local_160;
  double local_158;
  ulong local_150;
  int local_144;
  ulong local_140;
  ulong local_138;
  double local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  double local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  double local_f0;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  double local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  double local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  double local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  double local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  double local_50;
  ulong local_48;
  int local_3c;
  int local_38;
  int local_34;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  for (local_34 = 0; local_34 < *(int *)(in_RDI + 0x34); local_34 = local_34 + 1) {
    local_38 = local_34 * 4 * *(int *)(in_RDI + 0x18);
    local_3c = local_34 * 0x18;
    local_48 = *(ulong *)(local_20 + (long)local_3c * 8);
    local_50 = *(double *)(local_20 + (long)(local_3c + 1) * 8);
    local_58 = *(ulong *)(local_20 + (long)(local_3c + 2) * 8);
    local_60 = *(ulong *)(local_20 + (long)(local_3c + 3) * 8);
    local_68 = *(ulong *)(local_20 + (long)(local_3c + 6) * 8);
    local_70 = *(double *)(local_20 + (long)(local_3c + 7) * 8);
    local_78 = *(ulong *)(local_20 + (long)(local_3c + 8) * 8);
    local_80 = *(ulong *)(local_20 + (long)(local_3c + 9) * 8);
    local_88 = *(ulong *)(local_20 + (long)(local_3c + 0xc) * 8);
    local_90 = *(double *)(local_20 + (long)(local_3c + 0xd) * 8);
    local_98 = *(ulong *)(local_20 + (long)(local_3c + 0xe) * 8);
    local_a0 = *(ulong *)(local_20 + (long)(local_3c + 0xf) * 8);
    local_a8 = *(ulong *)(local_20 + (long)(local_3c + 0x12) * 8);
    local_b0 = *(double *)(local_20 + (long)(local_3c + 0x13) * 8);
    local_b8 = *(ulong *)(local_20 + (long)(local_3c + 0x14) * 8);
    local_c0 = *(ulong *)(local_20 + (long)(local_3c + 0x15) * 8);
    local_c8 = *(ulong *)(local_30 + (long)local_3c * 8);
    local_d0 = *(double *)(local_30 + (long)(local_3c + 1) * 8);
    local_d8 = *(ulong *)(local_30 + (long)(local_3c + 2) * 8);
    local_e0 = *(ulong *)(local_30 + (long)(local_3c + 3) * 8);
    local_e8 = *(ulong *)(local_30 + (long)(local_3c + 6) * 8);
    local_f0 = *(double *)(local_30 + (long)(local_3c + 7) * 8);
    local_f8 = *(ulong *)(local_30 + (long)(local_3c + 8) * 8);
    local_100 = *(ulong *)(local_30 + (long)(local_3c + 9) * 8);
    local_108 = *(ulong *)(local_30 + (long)(local_3c + 0xc) * 8);
    local_110 = *(double *)(local_30 + (long)(local_3c + 0xd) * 8);
    local_118 = *(ulong *)(local_30 + (long)(local_3c + 0xe) * 8);
    local_120 = *(ulong *)(local_30 + (long)(local_3c + 0xf) * 8);
    local_128 = *(ulong *)(local_30 + (long)(local_3c + 0x12) * 8);
    local_130 = *(double *)(local_30 + (long)(local_3c + 0x13) * 8);
    local_138 = *(ulong *)(local_30 + (long)(local_3c + 0x14) * 8);
    local_140 = *(ulong *)(local_30 + (long)(local_3c + 0x15) * 8);
    for (local_144 = 0; local_144 < *(int *)(in_RDI + 0x14); local_144 = local_144 + 1) {
      local_150 = *(ulong *)(local_18 + (long)local_38 * 8);
      local_158 = *(double *)(local_18 + (long)(local_38 + 1) * 8);
      local_160 = *(ulong *)(local_18 + (long)(local_38 + 2) * 8);
      local_168 = *(ulong *)(local_18 + (long)(local_38 + 3) * 8);
      local_170 = *(ulong *)(local_28 + (long)local_38 * 8);
      local_178 = *(double *)(local_28 + (long)(local_38 + 1) * 8);
      local_180 = *(ulong *)(local_28 + (long)(local_38 + 2) * 8);
      local_188 = *(ulong *)(local_28 + (long)(local_38 + 3) * 8);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_48;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_150;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = local_50 * local_158;
      auVar3 = vfmadd213sd_fma(auVar27,auVar3,auVar43);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_58;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = local_160;
      auVar3 = vfmadd213sd_fma(auVar44,auVar4,auVar3);
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_60;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_168;
      auVar3 = vfmadd213sd_fma(auVar5,auVar28,auVar3);
      local_190 = auVar3._0_8_;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_68;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_150;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = local_70 * local_158;
      auVar3 = vfmadd213sd_fma(auVar29,auVar6,auVar45);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_78;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = local_160;
      auVar3 = vfmadd213sd_fma(auVar46,auVar7,auVar3);
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_80;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_168;
      auVar3 = vfmadd213sd_fma(auVar8,auVar30,auVar3);
      local_198 = auVar3._0_8_;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_88;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = local_150;
      auVar47._8_8_ = 0;
      auVar47._0_8_ = local_90 * local_158;
      auVar3 = vfmadd213sd_fma(auVar31,auVar9,auVar47);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_98;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = local_160;
      auVar3 = vfmadd213sd_fma(auVar48,auVar10,auVar3);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = local_a0;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_168;
      auVar3 = vfmadd213sd_fma(auVar11,auVar32,auVar3);
      local_1a0 = auVar3._0_8_;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_a8;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = local_150;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = local_b0 * local_158;
      auVar3 = vfmadd213sd_fma(auVar33,auVar12,auVar49);
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_b8;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = local_160;
      auVar3 = vfmadd213sd_fma(auVar50,auVar13,auVar3);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = local_c0;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_168;
      auVar3 = vfmadd213sd_fma(auVar14,auVar34,auVar3);
      local_1a8 = auVar3._0_8_;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_c8;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = local_170;
      auVar51._8_8_ = 0;
      auVar51._0_8_ = local_d0 * local_178;
      auVar3 = vfmadd213sd_fma(auVar35,auVar15,auVar51);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_d8;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = local_180;
      auVar3 = vfmadd213sd_fma(auVar52,auVar16,auVar3);
      auVar36._8_8_ = 0;
      auVar36._0_8_ = local_e0;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_188;
      auVar3 = vfmadd213sd_fma(auVar17,auVar36,auVar3);
      local_1b0 = auVar3._0_8_;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_e8;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = local_170;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = local_f0 * local_178;
      auVar3 = vfmadd213sd_fma(auVar37,auVar18,auVar53);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_f8;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = local_180;
      auVar3 = vfmadd213sd_fma(auVar54,auVar19,auVar3);
      auVar38._8_8_ = 0;
      auVar38._0_8_ = local_100;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_188;
      auVar3 = vfmadd213sd_fma(auVar20,auVar38,auVar3);
      local_1b8 = auVar3._0_8_;
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_108;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = local_170;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = local_110 * local_178;
      auVar3 = vfmadd213sd_fma(auVar39,auVar21,auVar55);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_118;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = local_180;
      auVar3 = vfmadd213sd_fma(auVar56,auVar22,auVar3);
      auVar40._8_8_ = 0;
      auVar40._0_8_ = local_120;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_188;
      auVar3 = vfmadd213sd_fma(auVar23,auVar40,auVar3);
      local_1c0 = auVar3._0_8_;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_128;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = local_170;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = local_130 * local_178;
      auVar3 = vfmadd213sd_fma(auVar41,auVar24,auVar57);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_138;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = local_180;
      auVar3 = vfmadd213sd_fma(auVar58,auVar25,auVar3);
      auVar42._8_8_ = 0;
      auVar42._0_8_ = local_140;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = local_188;
      auVar3 = vfmadd213sd_fma(auVar26,auVar42,auVar3);
      local_1c8 = auVar3._0_8_;
      *(double *)(local_10 + (long)local_38 * 8) = local_190 * local_1b0;
      *(double *)(local_10 + (long)(local_38 + 1) * 8) = local_198 * local_1b8;
      *(double *)(local_10 + (long)(local_38 + 2) * 8) = local_1a0 * local_1c0;
      *(double *)(local_10 + (long)(local_38 + 3) * 8) = local_1a8 * local_1c8;
      if (*_expMax == 0) {
        frexp(*(double *)(local_10 + (long)local_38 * 8),&local_1d0);
        frexp(*(double *)(local_10 + (long)(local_38 + 1) * 8),&local_1cc);
        iVar1 = local_1cc;
        if (local_1cc < 1) {
          iVar1 = -local_1cc;
        }
        iVar2 = local_1d0;
        if (local_1d0 < 1) {
          iVar2 = -local_1d0;
        }
        if (iVar2 < iVar1) {
          local_1d0 = local_1cc;
        }
        frexp(*(double *)(local_10 + (long)(local_38 + 2) * 8),&local_1cc);
        iVar1 = local_1cc;
        if (local_1cc < 1) {
          iVar1 = -local_1cc;
        }
        iVar2 = local_1d0;
        if (local_1d0 < 1) {
          iVar2 = -local_1d0;
        }
        if (iVar2 < iVar1) {
          local_1d0 = local_1cc;
        }
        frexp(*(double *)(local_10 + (long)(local_38 + 3) * 8),&local_1cc);
        iVar1 = local_1cc;
        if (local_1cc < 1) {
          iVar1 = -local_1cc;
        }
        iVar2 = local_1d0;
        if (local_1d0 < 1) {
          iVar2 = -local_1d0;
        }
        if (iVar2 < iVar1) {
          local_1d0 = local_1cc;
        }
        iVar1 = local_1d0;
        if (local_1d0 < 1) {
          iVar1 = -local_1d0;
        }
        if (*(int *)(in_RDI + 0x68) < iVar1) {
          *_expMax = 1;
        }
      }
      local_38 = local_38 + 4;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcPartialsPartialsAutoScaling(REALTYPE* destP,
                                                                    const REALTYPE* partials1,
                                                                    const REALTYPE* matrices1,
                                                                    const REALTYPE* partials2,
                                                                    const REALTYPE* matrices2,
                                                                    int* activateScaling) {


#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int u = l*4*kPaddedPatternCount;
        int w = l*4*OFFSET;

        PREFETCH_MATRIX(1,matrices1,w);
        PREFETCH_MATRIX(2,matrices2,w);
        for (int k = 0; k < kPatternCount; k++) {
            PREFETCH_PARTIALS(1,partials1,u);
            PREFETCH_PARTIALS(2,partials2,u);

            DO_INTEGRATION(1); // defines sum10, sum11, sum12, sum13
            DO_INTEGRATION(2); // defines sum20, sum21, sum22, sum23

            // Final results
            destP[u    ] = sum10 * sum20;
            destP[u + 1] = sum11 * sum21;
            destP[u + 2] = sum12 * sum22;
            destP[u + 3] = sum13 * sum23;

            if (*activateScaling == 0) {
                int expTmp;
                int expMax;
                frexp(destP[u], &expMax);
                frexp(destP[u + 1], &expTmp);
                if (abs(expTmp) > abs(expMax))
                    expMax = expTmp;
                frexp(destP[u + 2], &expTmp);
                if (abs(expTmp) > abs(expMax))
                    expMax = expTmp;
                frexp(destP[u + 3], &expTmp);
                if (abs(expTmp) > abs(expMax))
                    expMax = expTmp;

                if(abs(expMax) > scalingExponentThreshold) {
                    *activateScaling = 1;
                }
            }

            u += 4;

        }
    }
}